

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

int lest::run<12ul>(test (*specification) [12],ostream *os)

{
  long lVar1;
  
  for (lVar1 = 0x300; lVar1 != 0; lVar1 = lVar1 + -0x40) {
    std::function<void_()>::operator()(&(*specification)[0].behaviour);
    specification = (test (*) [12])((long)specification + 0x40);
  }
  return 0;
}

Assistant:

int run( test const (&specification)[N], std::ostream & os = std::cout )
{
    int failures = 0;

    for ( auto & testing : specification )
    {
        try
        {
            testing.behaviour();
        }
        catch( message const & e )
        {
            ++failures;
            report( os, e, testing.name );
        }
    }

    if ( failures > 0 )
    {
        os << failures << " out of " << N << " " << pluralise("test", N) << " failed." << std::endl;
    }

    return failures;
}